

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.h
# Opt level: O0

uint64_t __thiscall xmrig::Worker::timestamp(Worker *this)

{
  long in_RDI;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return *(uint64_t *)(in_RDI + 0x20);
}

Assistant:

inline uint64_t timestamp() const override          { return m_timestamp.load(std::memory_order_relaxed); }